

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

int av1_convert_sect5obus_to_annexb(uint8_t *buffer,size_t buffer_size,size_t *frame_size)

{
  int iVar1;
  size_t available;
  size_t __n;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  uint64_t value;
  uint8_t saved_obu_header [2];
  uint64_t obu_payload_size;
  size_t coded_obu_size;
  size_t length_of_payload_size;
  byte local_7a [2];
  uint64_t local_78;
  size_t local_70;
  size_t local_68;
  size_t *local_60;
  uint64_t local_58;
  byte *local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  sVar3 = *frame_size;
  local_70 = 0;
  local_60 = frame_size;
  local_48 = buffer_size;
  do {
    if (sVar3 == 0) {
      *local_60 = local_70;
      return 0;
    }
    __n = 2 - (ulong)((*buffer & 4) == 0);
    memcpy(local_7a,buffer,__n);
    local_7a[0] = local_7a[0] & 0xfd;
    iVar1 = aom_uleb_decode(buffer + __n,sVar3 - __n,&local_78,&local_38);
    if (iVar1 == 0) {
      lVar2 = local_38 + __n;
      value = local_78 + __n;
      available = aom_uleb_size_in_bytes(value);
      local_68 = sVar3;
      if (local_48 - (local_70 + (sVar3 - lVar2)) < available + __n) {
        bVar4 = false;
      }
      else {
        local_50 = buffer + available;
        memmove(local_50 + __n,buffer + lVar2,sVar3 - lVar2);
        local_58 = local_78;
        iVar1 = aom_uleb_encode(value,available,buffer,&local_40);
        bVar4 = local_40 == available && iVar1 == 0;
        sVar3 = local_68;
        if (local_40 == available && iVar1 == 0) {
          memcpy(local_50,local_7a,__n);
          buffer = buffer + available + value;
          local_70 = local_70 + available + value;
          sVar3 = local_68 - (lVar2 + local_58);
        }
      }
    }
    else {
      bVar4 = false;
    }
  } while (bVar4);
  return 1;
}

Assistant:

int av1_convert_sect5obus_to_annexb(uint8_t *buffer, size_t buffer_size,
                                    size_t *frame_size) {
  assert(*frame_size <= buffer_size);
  size_t output_size = 0;
  size_t remaining_size = *frame_size;
  uint8_t *buff_ptr = buffer;

  // go through each OBUs
  while (remaining_size > 0) {
    uint8_t saved_obu_header[2];
    uint64_t obu_payload_size;
    size_t length_of_payload_size;
    size_t length_of_obu_size;
    const uint32_t obu_header_size = (buff_ptr[0] >> 2) & 0x1 ? 2 : 1;
    size_t obu_bytes_read = obu_header_size;  // bytes read for current obu

    // save the obu header (1 or 2 bytes)
    memcpy(saved_obu_header, buff_ptr, obu_header_size);
    // clear the obu_has_size_field
    saved_obu_header[0] &= ~0x2;

    // get the payload_size and length of payload_size
    if (aom_uleb_decode(buff_ptr + obu_header_size,
                        remaining_size - obu_header_size, &obu_payload_size,
                        &length_of_payload_size) != 0) {
      return AOM_CODEC_ERROR;
    }
    obu_bytes_read += length_of_payload_size;

    // calculate the length of size of the obu header plus payload
    const uint64_t obu_size = obu_header_size + obu_payload_size;
    length_of_obu_size = aom_uleb_size_in_bytes(obu_size);

    if (length_of_obu_size + obu_header_size >
        buffer_size - output_size - (remaining_size - obu_bytes_read)) {
      return AOM_CODEC_ERROR;
    }
    // move the rest of data to new location
    memmove(buff_ptr + length_of_obu_size + obu_header_size,
            buff_ptr + obu_bytes_read, remaining_size - obu_bytes_read);
    obu_bytes_read += (size_t)obu_payload_size;

    // write the new obu size
    size_t coded_obu_size;
    if (aom_uleb_encode(obu_size, length_of_obu_size, buff_ptr,
                        &coded_obu_size) != 0 ||
        coded_obu_size != length_of_obu_size) {
      return AOM_CODEC_ERROR;
    }

    // write the saved (modified) obu_header following obu size
    memcpy(buff_ptr + length_of_obu_size, saved_obu_header, obu_header_size);

    remaining_size -= obu_bytes_read;
    buff_ptr += length_of_obu_size + (size_t)obu_size;
    output_size += length_of_obu_size + (size_t)obu_size;
  }

  *frame_size = output_size;
  return AOM_CODEC_OK;
}